

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.hpp
# Opt level: O2

unique_ptr<double[],_std::default_delete<double[]>_> __thiscall
qclab::dense::alloc_unique_array<double>(dense *this,int64_t size)

{
  void *pvVar1;
  __uniq_ptr_impl<double,_std::default_delete<double[]>_> local_10;
  
  if (0 < size) {
    pvVar1 = operator_new__(-(ulong)((ulong)size >> 0x3d != 0) | size << 3);
    *(void **)this = pvVar1;
    local_10._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
    super__Head_base<0UL,_double_*,_false>._M_head_impl =
         (tuple<double_*,_std::default_delete<double[]>_>)
         (_Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>)0x0;
    std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
              ((unique_ptr<double[],_std::default_delete<double[]>_> *)&local_10);
    return (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
           (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)this;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/memory.hpp"
                ,0x12,"auto qclab::dense::alloc_unique_array(const int64_t) [T = double]");
}

Assistant:

inline auto alloc_unique_array( const int64_t size ) {
      assert( size > 0 ) ;
      std::unique_ptr< T[] > mem( new T[size] ) ;
      assert( mem.get() != nullptr ) ;
      return mem ;
    }